

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

void __thiscall libDAI::NDP::SelectStateForVar(NDP *this,size_t varOrderI)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  reference pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  size_t varI;
  size_t br;
  size_t jI;
  multind mi;
  size_t nvI;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indivIndices;
  nb_type vsI;
  VarSet *vs;
  Factor *fI;
  size_type in_stack_fffffffffffffea8;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffeb0;
  multind *this_00;
  allocator_type *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed8;
  multind *in_stack_fffffffffffffee0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffef8;
  VarSet *in_stack_ffffffffffffff30;
  NDP *in_stack_ffffffffffffff38;
  multind *in_stack_ffffffffffffff40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  VarSet *local_20;
  reference local_18;
  
  local_18 = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_20 = TFactor<double>::vars(local_18);
  NBFromVarSet(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_38);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xbb7bf5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xbb7c1b);
  local_70 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    pvVar3 = local_70;
    pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_38);
    if (pvVar1 <= pvVar3) break;
    in_stack_fffffffffffffef8 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffee0 = (multind *)*pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *pvVar2 = (value_type)in_stack_fffffffffffffee0;
    local_70 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  multind::multind(in_stack_ffffffffffffff40,(VarSet *)in_stack_ffffffffffffff38);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (pvVar3,in_stack_fffffffffffffef8);
  multind::li(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffec0);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::at((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  this_00 = (multind *)*pvVar2;
  pvVar3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this_00->_dims,in_stack_fffffffffffffea8);
  *pvVar2 = (value_type)this_00;
  multind::~multind(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar3);
  return;
}

Assistant:

void NDP::SelectStateForVar(size_t varOrderI)
    {
        //get the factor that was introduced when eliminating varOrderI
        Factor& fI = _m_newFacs.at(varOrderI);
        
        //get the variables involved
        const VarSet & vs = fI.vars();
        nb_type vsI = NBFromVarSet(vs);
        
        //see what states they have selected
        std::vector<size_t> indivIndices( vsI.size() );
        for(size_t i=0; i < vsI.size(); i++)
        {
            size_t nvI = vsI.at(i);
            indivIndices.at(i) = _m_bestConfiguration.at(nvI);
        }

        //compute the joint state
        multind mi(vs);
        size_t jI = mi.li( indivIndices );
        //size_t jI2 = Factor::IndividualToJointFactorIndex(vs, indivIndices);
        //if (jI != jI2)
            //cout << "(jI != jI2): " << jI <<"!="<< jI2 << endl;

        //look up varOrderI's best response
        size_t br = _m_bestResps.at(varOrderI).at(jI);

        //register varOrderI's choice
        size_t varI = _m_varOrder.at(varOrderI);
        _m_bestConfiguration.at(varI) = br;
    }